

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O3

void test_char<char>(void)

{
  bool bVar1;
  __locale_t __dataset;
  ostream *poVar2;
  string *psVar3;
  bool bVar4;
  long lVar5;
  locale l;
  generator gen;
  string name;
  locale l_1;
  string names [2];
  string local_1b0 [8];
  generator local_1a8 [8];
  char *local_1a0;
  long local_198;
  char local_190 [16];
  string local_180;
  string local_160;
  string local_140 [8];
  string local_138;
  string local_118;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [24];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  booster::locale::generator::generator(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing at least C",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"en_US.UTF-8","");
  booster::locale::generator::generate(local_1b0);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"b","");
  test_one<char>((locale *)local_1b0,&local_50,&local_70,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"a","");
  test_one<char>((locale *)local_1b0,&local_90,&local_b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_1a0 = local_190;
  local_198 = 0;
  local_190[0] = '\0';
  psVar3 = (string *)local_f8;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>(psVar3,"en_US.UTF-8","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"en_US.ISO8859-1","");
  bVar1 = true;
  do {
    bVar4 = bVar1;
    __dataset = newlocale(0x1fbf,*(char **)psVar3,(__locale_t)0x0);
    if (__dataset == (__locale_t)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)psVar3,*(long *)(psVar3 + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," not supported, skipping",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      freelocale(__dataset);
      std::__cxx11::string::_M_assign((string *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Testing ",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1a0,local_198);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      booster::locale::generator::generate(local_140);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"a","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,anon_var_dwarf_3abd,anon_var_dwarf_3abd + 2);
      test_one<char>((locale *)local_140,&local_160,&local_118,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,anon_var_dwarf_3abd,anon_var_dwarf_3abd + 2);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,anon_var_dwarf_3a47 + 0x28,anon_var_dwarf_3a47 + 0x29);
      test_one<char>((locale *)local_140,&local_180,&local_138,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      std::locale::~locale((locale *)local_140);
    }
    psVar3 = (string *)local_d8;
    bVar1 = false;
  } while (bVar4);
  lVar5 = 0;
  do {
    if (local_c8 + lVar5 != *(undefined1 **)((long)local_d8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_d8 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  std::locale::~locale((locale *)local_1b0);
  booster::locale::generator::~generator(local_1a8);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;
    
    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"a","b",-1);
    test_one<CharType>(l,"a","a",0);

    std::string name;


    #if !defined(__APPLE__) && !defined(__FreeBSD__)
    std::string names[] = { "en_US.UTF-8", "en_US.ISO8859-1" };
    for(unsigned i=0;i<sizeof(names)/sizeof(names[0]);i++) {
        if(have_locale(names[i])) {
            name = names[i];
            std::cout << "- Testing " << name << std::endl;
            std::locale l=gen(name);
            test_one<CharType>(l,"a","ç",-1);
            test_one<CharType>(l,"ç","d",-1);
        }
        else {
            std::cout << "- " << names[i] << " not supported, skipping" << std::endl;
        }
    }
    #else
    std::cout << "- Collation is broken on this OS C standard library, skipping" << std::endl;
    #endif
}